

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O3

XMLSize_t __thiscall xercesc_4_0::ReaderMgr::getReaderDepth(ReaderMgr *this)

{
  if (this->fReaderStack != (RefStackOf<xercesc_4_0::ReaderMgr::ReaderData> *)0x0) {
    return ((this->fReaderStack->fVector).super_BaseRefVectorOf<xercesc_4_0::ReaderMgr::ReaderData>.
            fCurCount + 1) - (ulong)(this->fCurReader == (XMLReader *)0x0);
  }
  return 0;
}

Assistant:

XMLSize_t ReaderMgr::getReaderDepth() const
{
    // If the stack doesn't exist, its obviously zero
    if (!fReaderStack)
        return 0;

    //
    //  The return is the stack size, plus one if there is a current
    //  reader. So if there is no current reader and none on the stack,
    //  its zero, else its some non-zero value.
    //
    XMLSize_t retVal = fReaderStack->size();
    if (fCurReader)
        retVal++;
    return retVal;
}